

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.c
# Opt level: O1

int lws_dynamic_token_insert(lws *wsi,int hdr_len,int lws_hdr_index,char *arg,size_t len)

{
  hpack_dynamic_table *dyn;
  uint32_t *puVar1;
  undefined8 *puVar2;
  ushort uVar3;
  ushort uVar4;
  uint32_t uVar5;
  lws_h2_netconn *plVar6;
  hpack_dt_entry *phVar7;
  char *pcVar8;
  lws *plVar9;
  void *pvVar10;
  uint16_t uVar11;
  int iVar12;
  char *pcVar13;
  uint idx;
  ulong uVar14;
  
  plVar9 = lws_get_network_wsi(wsi);
  plVar6 = (plVar9->h2).h2n;
  iVar12 = 1;
  if (plVar6 != (lws_h2_netconn *)0x0) {
    if ((plVar6->hpack_dyn_table).entries == (hpack_dt_entry *)0x0) {
      _lws_log(1,"%s: unsized dyn table\n","lws_dynamic_token_insert");
      iVar12 = 1;
    }
    else {
      uVar3 = (plVar6->hpack_dyn_table).num_entries;
      if (uVar3 == 0) {
        idx = 0;
      }
      else {
        idx = (uint)((plVar6->hpack_dyn_table).pos % uVar3);
      }
      dyn = &plVar6->hpack_dyn_table;
      if ((uVar3 != 0) && ((plVar6->hpack_dyn_table).used_entries == uVar3)) {
        if ((plVar6->hpack_dyn_table).virtual_payload_usage <
            (plVar6->hpack_dyn_table).virtual_payload_max) {
          _lws_log(1,"Dropping header content before limit!\n");
        }
        lws_dynamic_free(dyn,idx);
      }
      uVar5 = (plVar6->hpack_dyn_table).virtual_payload_usage;
      while (((uVar5 != 0 && (uVar3 = (plVar6->hpack_dyn_table).used_entries, uVar3 != 0)) &&
             ((ulong)((plVar6->hpack_dyn_table).virtual_payload_max + 0x400) <
              (uVar5 + hdr_len) + len))) {
        uVar4 = (plVar6->hpack_dyn_table).num_entries;
        if (uVar4 == 0) {
          iVar12 = 0;
        }
        else {
          iVar12 = (int)((uint)(plVar6->hpack_dyn_table).pos - (uint)uVar3) % (int)(uint)uVar4;
        }
        lws_dynamic_free(dyn,(iVar12 >> 0x1f & (uint)uVar4) + iVar12);
        uVar5 = (plVar6->hpack_dyn_table).virtual_payload_usage;
      }
      uVar3 = (plVar6->hpack_dyn_table).used_entries;
      if (uVar3 < (plVar6->hpack_dyn_table).num_entries) {
        (plVar6->hpack_dyn_table).used_entries = uVar3 + 1;
      }
      puVar2 = (undefined8 *)((long)&dyn->entries->value + (ulong)(idx << 4));
      *(undefined2 *)((long)&dyn->entries->value_len + (ulong)(idx << 4)) = 0;
      if (lws_hdr_index == 0xffff) {
        *puVar2 = 0;
      }
      else {
        pvVar10 = (void *)*puVar2;
        if (pvVar10 != (void *)0x0) {
          lws_realloc(pvVar10,0,"free");
          *(undefined8 *)((long)&dyn->entries->value + (ulong)(idx << 4)) = 0;
        }
        pvVar10 = lws_realloc((void *)0x0,len + 1,"hpack dyn");
        *(void **)((long)&dyn->entries->value + (ulong)(idx << 4)) = pvVar10;
        if (pvVar10 == (void *)0x0) {
          return 1;
        }
        memcpy(pvVar10,arg,len);
        *(undefined1 *)(*(long *)((long)&dyn->entries->value + (ulong)(idx << 4)) + len) = 0;
        *(short *)((long)&dyn->entries->value_len + (ulong)(idx << 4)) = (short)len;
      }
      phVar7 = (plVar6->hpack_dyn_table).entries;
      uVar14 = (ulong)(idx << 4);
      *(short *)((long)&phVar7->lws_hdr_idx + uVar14) = (short)lws_hdr_index;
      *(short *)((long)&phVar7->hdr_len + uVar14) = (short)hdr_len;
      puVar1 = &(plVar6->hpack_dyn_table).virtual_payload_usage;
      *puVar1 = *puVar1 + (int)len + hdr_len;
      pcVar8 = *(char **)((long)&phVar7->value + uVar14);
      pcVar13 = "null";
      if (pcVar8 != (char *)0x0) {
        pcVar13 = pcVar8;
      }
      _lws_log(8,"%s: index %ld: lws_hdr_index 0x%x, hdr len %d, \'%s\' len %d\n",
               "lws_dynamic_token_insert",0x3e,(ulong)(uint)lws_hdr_index,(ulong)(uint)hdr_len,
               pcVar13,len);
      uVar3 = (plVar6->hpack_dyn_table).num_entries;
      if (uVar3 == 0) {
        uVar11 = 0;
      }
      else {
        uVar11 = (uint16_t)(((plVar6->hpack_dyn_table).pos + 1) % (uint)uVar3);
      }
      (plVar6->hpack_dyn_table).pos = uVar11;
      iVar12 = 0;
    }
  }
  return iVar12;
}

Assistant:

static int
lws_dynamic_token_insert(struct lws *wsi, int hdr_len,
			 int lws_hdr_index, char *arg, size_t len)
{
	struct hpack_dynamic_table *dyn;
	int new_index;

	/* dynamic table only belongs to network wsi */
	wsi = lws_get_network_wsi(wsi);
	if (!wsi->h2.h2n)
		return 1;
	dyn = &wsi->h2.h2n->hpack_dyn_table;

	if (!dyn->entries) {
		lwsl_err("%s: unsized dyn table\n", __func__);

		return 1;
	}
	lws_h2_dynamic_table_dump(wsi);

	new_index = lws_safe_modulo(dyn->pos, dyn->num_entries);
	if (dyn->num_entries && dyn->used_entries == dyn->num_entries) {
		if (dyn->virtual_payload_usage < dyn->virtual_payload_max)
			lwsl_err("Dropping header content before limit!\n");
		/* we have to drop the oldest to make space */
		lws_dynamic_free(dyn, new_index);
	}

	/*
	 * evict guys to make room, allowing for some overage.  We have to
	 * take care about getting a single huge header, and evicting
	 * everything
	 */

	while (dyn->virtual_payload_usage &&
	       dyn->used_entries &&
	       dyn->virtual_payload_usage + (unsigned int)hdr_len + len >
				dyn->virtual_payload_max + 1024) {
		int n = lws_safe_modulo(dyn->pos - dyn->used_entries,
						dyn->num_entries);
		if (n < 0)
			n += dyn->num_entries;
		lws_dynamic_free(dyn, n);
	}

	if (dyn->used_entries < dyn->num_entries)
		dyn->used_entries++;

	dyn->entries[new_index].value_len = 0;

	if (lws_hdr_index != LWS_HPACK_IGNORE_ENTRY) {
		if (dyn->entries[new_index].value)
			lws_free_set_NULL(dyn->entries[new_index].value);
		dyn->entries[new_index].value =
				lws_malloc(len + 1, "hpack dyn");
		if (!dyn->entries[new_index].value)
			return 1;

		memcpy(dyn->entries[new_index].value, arg, len);
		dyn->entries[new_index].value[len] = '\0';
		dyn->entries[new_index].value_len = (uint16_t)len;
	} else
		dyn->entries[new_index].value = NULL;

	dyn->entries[new_index].lws_hdr_idx = (uint16_t)lws_hdr_index;
	dyn->entries[new_index].hdr_len = (uint16_t)hdr_len;

	dyn->virtual_payload_usage = (uint32_t)(dyn->virtual_payload_usage +
					(unsigned int)hdr_len + len);

	lwsl_info("%s: index %ld: lws_hdr_index 0x%x, hdr len %d, '%s' len %d\n",
		  __func__, (long)LWS_ARRAY_SIZE(static_token),
		  lws_hdr_index, hdr_len, dyn->entries[new_index].value ?
				 dyn->entries[new_index].value : "null", (int)len);

	dyn->pos = (uint16_t)lws_safe_modulo(dyn->pos + 1, dyn->num_entries);

	lws_h2_dynamic_table_dump(wsi);

	return 0;
}